

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O1

void __thiscall Args::Help::Help(Help *this,bool throwExceptionOnPrint)

{
  HelpPrinterIface *pHVar1;
  long *local_40 [2];
  long local_30 [2];
  
  Arg::Arg<char_const(&)[5]>(&this->super_Arg,'h',(char (*) [5])"help",true,false);
  (this->super_Arg).super_ArgIface._vptr_ArgIface = (_func_int **)&PTR__Help_00115b30;
  pHVar1 = (HelpPrinterIface *)operator_new(0x58);
  pHVar1->_vptr_HelpPrinterIface = (_func_int **)&PTR__HelpPrinter_00115ab0;
  pHVar1[1]._vptr_HelpPrinterIface = (_func_int **)(pHVar1 + 3);
  pHVar1[2]._vptr_HelpPrinterIface = (_func_int **)0x0;
  *(undefined1 *)&pHVar1[3]._vptr_HelpPrinterIface = 0;
  pHVar1[5]._vptr_HelpPrinterIface = (_func_int **)(pHVar1 + 7);
  pHVar1[6]._vptr_HelpPrinterIface = (_func_int **)0x0;
  *(undefined1 *)&pHVar1[7]._vptr_HelpPrinterIface = 0;
  pHVar1[9]._vptr_HelpPrinterIface = (_func_int **)0x0;
  pHVar1[10]._vptr_HelpPrinterIface = (_func_int **)0x4f;
  (this->m_printer)._M_t.
  super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>._M_t.
  super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>.
  super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl = pHVar1;
  this->m_throwExceptionOnPrint = throwExceptionOnPrint;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Print this help.","");
  std::__cxx11::string::_M_assign((string *)&(this->super_Arg).m_description);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Print this help.","");
  std::__cxx11::string::_M_assign((string *)&(this->super_Arg).m_longDescription);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

inline
Help::Help( bool throwExceptionOnPrint )
	:	Arg( SL( 'h' ), SL( "help" ), true, false )
	,	m_printer( new HelpPrinter )
	,	m_throwExceptionOnPrint( throwExceptionOnPrint )
{
	setDescription( SL( "Print this help." ) );
	setLongDescription( SL( "Print this help." ) );
}